

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectangularVolumeRecord3.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::RectangularVolumeRecord3::RectangularVolumeRecord3
          (RectangularVolumeRecord3 *this,KUINT8 Index,WorldCoordinates *CenterLocation,
          Vector *RectangleLength,EulerAngles *Orientation)

{
  EulerAngles *Orientation_local;
  Vector *RectangleLength_local;
  WorldCoordinates *CenterLocation_local;
  KUINT8 Index_local;
  RectangularVolumeRecord3 *this_local;
  
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__RectangularVolumeRecord3_004f3890;
  WorldCoordinates::WorldCoordinates(&this->m_CentLocation,CenterLocation);
  Vector::Vector(&this->m_RecLength,RectangleLength);
  EulerAngles::EulerAngles(&this->m_Ori,Orientation);
  (this->super_EnvironmentRecord).m_ui8Index = Index;
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x5000000;
  (this->super_EnvironmentRecord).m_ui16Length = 0x180;
  return;
}

Assistant:

RectangularVolumeRecord3::RectangularVolumeRecord3( KUINT8 Index, const WorldCoordinates & CenterLocation, const Vector & RectangleLength,
        const EulerAngles & Orientation ) :
    m_CentLocation( CenterLocation ),
    m_RecLength( RectangleLength ),
    m_Ori( Orientation )
{
    m_ui8Index = Index;
    m_ui32EnvRecTyp = RectangularVolumeRecord3Type;
    m_ui16Length = ( RECTANGLE_VOLUME_RECORD_3_SIZE - ENVIRONMENT_RECORD_SIZE ) * 8;
}